

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::is_msl_shader_input_used(CompilerMSL *this,uint32_t location)

{
  size_type sVar1;
  bool local_15;
  uint32_t local_14;
  CompilerMSL *pCStack_10;
  uint32_t location_local;
  CompilerMSL *this_local;
  
  local_14 = location;
  pCStack_10 = this;
  sVar1 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&this->location_inputs_in_use,&local_14);
  local_15 = false;
  if (sVar1 != 0) {
    sVar1 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->location_inputs_in_use_fallback,&local_14);
    local_15 = sVar1 == 0;
  }
  return local_15;
}

Assistant:

bool CompilerMSL::is_msl_shader_input_used(uint32_t location)
{
	// Don't report internal location allocations to app.
	return location_inputs_in_use.count(location) != 0 &&
	       location_inputs_in_use_fallback.count(location) == 0;
}